

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_aes_crypt_ofb
              (mbedtls_aes_context *ctx,size_t length,size_t *iv_off,uchar *iv,uchar *input,
              uchar *output)

{
  ulong local_50;
  size_t n;
  byte *pbStack_40;
  int ret;
  uchar *output_local;
  uchar *input_local;
  uchar *iv_local;
  size_t *iv_off_local;
  size_t length_local;
  mbedtls_aes_context *ctx_local;
  
  n._4_4_ = 0;
  local_50 = *iv_off;
  pbStack_40 = output;
  output_local = input;
  iv_off_local = (size_t *)length;
  if (local_50 < 0x10) {
    while (iv_off_local != (size_t *)0x0) {
      if ((local_50 == 0) && (n._4_4_ = mbedtls_aes_crypt_ecb(ctx,1,iv,iv), n._4_4_ != 0))
      goto LAB_0013ba0b;
      *pbStack_40 = *output_local ^ iv[local_50];
      local_50 = local_50 + 1 & 0xf;
      pbStack_40 = pbStack_40 + 1;
      output_local = output_local + 1;
      iv_off_local = (size_t *)((long)iv_off_local + -1);
    }
    *iv_off = local_50;
LAB_0013ba0b:
    ctx_local._4_4_ = n._4_4_;
  }
  else {
    ctx_local._4_4_ = -0x21;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_aes_crypt_ofb( mbedtls_aes_context *ctx,
                           size_t length,
                           size_t *iv_off,
                           unsigned char iv[16],
                           const unsigned char *input,
                           unsigned char *output )
{
    int ret = 0;
    size_t n;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( iv_off != NULL );
    AES_VALIDATE_RET( iv != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    n = *iv_off;

    if( n > 15 )
        return( MBEDTLS_ERR_AES_BAD_INPUT_DATA );

    while( length-- )
    {
        if( n == 0 )
        {
            ret = mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );
            if( ret != 0 )
                goto exit;
        }
        *output++ =  *input++ ^ iv[n];

        n = ( n + 1 ) & 0x0F;
    }

    *iv_off = n;

exit:
    return( ret );
}